

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

char ** Qiniu_Region_Get_Io_Alternative_Hosts(Qiniu_Region *region,size_t *count)

{
  _Qiniu_Region_Service *p_Var1;
  char **ppcVar2;
  
  if (count != (size_t *)0x0) {
    *count = 0;
  }
  if ((((region != (Qiniu_Region *)0x0) &&
       (p_Var1 = region->ioService, p_Var1 != (_Qiniu_Region_Service *)0x0)) &&
      (ppcVar2 = p_Var1->hosts, ppcVar2 != (char **)0x0)) && (p_Var1->alternativeHostsCount != 0)) {
    if (count != (size_t *)0x0) {
      *count = p_Var1->alternativeHostsCount;
    }
    return ppcVar2 + p_Var1->acceleratedHostsCount + p_Var1->preferredHostsCount;
  }
  return (char **)0x0;
}

Assistant:

const char *const *Qiniu_Region_Get_Io_Alternative_Hosts(Qiniu_Region *region, size_t *count)
{
    if (count != NULL)
    {
        *count = 0;
    }
    if (region == NULL)
    {
        return NULL;
    }
    if (region->ioService == NULL)
    {
        return NULL;
    }
    if (region->ioService->hosts == NULL || region->ioService->alternativeHostsCount == 0)
    {
        return NULL;
    }
    if (count != NULL)
    {
        *count = region->ioService->alternativeHostsCount;
    }
    return region->ioService->hosts + region->ioService->acceleratedHostsCount + region->ioService->preferredHostsCount;
}